

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O3

void shared_strings_callback_find_shared_stringitem_start
               (void *callbackdata,XML_Char *name,XML_Char **atts)

{
  int iVar1;
  
  iVar1 = strcasecmp(name,"si");
  if (iVar1 != 0) {
    return;
  }
  if (*(void **)((long)callbackdata + 0x20) != (void *)0x0) {
    free(*(void **)((long)callbackdata + 0x20));
  }
  *(undefined8 *)((long)callbackdata + 0x20) = 0;
  *(undefined8 *)((long)callbackdata + 0x28) = 0;
  XML_SetElementHandler
            (*callbackdata,shared_strings_callback_find_shared_string_start,
             shared_strings_callback_find_sharedstringtable_end);
  return;
}

Assistant:

void shared_strings_callback_find_shared_stringitem_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if (XML_Char_icmp(name, X("si")) == 0) {
    if (data->text)
      free(data->text);
    data->text = NULL;
    data->textlen = 0;
    XML_SetElementHandler(data->xmlparser, shared_strings_callback_find_shared_string_start, shared_strings_callback_find_sharedstringtable_end);
  }
}